

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O2

void test_int32(void)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  int32_t i32;
  
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0,"foo",uVar2,0xf,10,0);
  uVar3 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar2,"foo",uVar3,0xf,&i32,0);
  if (cVar1 == '\0') {
    pcVar4 = "BCON_EXTRACT (bcon, \"foo\", BCONE_INT32 (i32))";
    uVar2 = 0xec;
  }
  else {
    if (i32 == 10) {
      bson_destroy(uVar2);
      return;
    }
    pcVar4 = "i32 == 10";
    uVar2 = 0xee;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar2,"test_int32",pcVar4);
  abort();
}

Assistant:

static void
test_int32 (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_int32 (&expected, "foo", -1, 100);

   BCON_APPEND (&bcon, "foo", BCON_INT32 (100));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}